

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_hex4.c
# Opt level: O0

void parse_hex4_should_parse_mixed_case(void)

{
  uint uVar1;
  
  uVar1 = parse_hex4((uchar *)"beef");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x31,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"beeF");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x32,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"beEf");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x33,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"beEF");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x34,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"bEef");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x35,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"bEeF");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x36,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"bEEf");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x37,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"bEEF");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x38,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"Beef");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x39,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"BeeF");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x3a,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"BeEf");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x3b,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"BeEF");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x3c,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"BEef");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x3d,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"BEeF");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x3e,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"BEEf");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x3f,UNITY_DISPLAY_STYLE_INT);
  uVar1 = parse_hex4((uchar *)"BEEF");
  UnityAssertEqualNumber(0xbeef,(ulong)uVar1,(char *)0x0,0x40,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void parse_hex4_should_parse_mixed_case(void)
{
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"beef"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"beeF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"beEf"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"beEF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"bEef"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"bEeF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"bEEf"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"bEEF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"Beef"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BeeF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BeEf"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BeEF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BEef"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BEeF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BEEf"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BEEF"));
}